

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O1

void __thiscall displayTest::test_method(displayTest *this)

{
  undefined8 *puVar1;
  ostream *poVar2;
  CartesianProduct S2;
  CartesianProduct S;
  CartesianProduct S3;
  RealSpace R2;
  SO3<mnf::ExpMapMatrix> RotSpace;
  S2 Sphere;
  RealSpace R5;
  RealSpace *local_418;
  S2 *local_410;
  RealSpace *local_408;
  S2 *local_400;
  SO3<mnf::ExpMapMatrix> *local_3f8;
  RealSpace *local_3f0;
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_3c0 [24];
  void *local_3a8;
  void *local_390;
  code *local_378 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_320 [24];
  void *local_308;
  void *local_2f0;
  code *local_2d8 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_280 [24];
  void *local_268;
  void *local_250;
  code *local_238 [11];
  void *local_1e0;
  void *local_1d0;
  SO3<mnf::ExpMapMatrix> local_1c0;
  S2 local_120 [136];
  code *local_98 [11];
  void *local_40;
  void *local_30;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_98,5);
  mnf::Manifold::display();
  mnf::RealSpace::RealSpace((RealSpace *)local_238,2);
  mnf::S2::S2(local_120);
  mnf::Manifold::display();
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1c0);
  local_418 = (RealSpace *)local_98;
  local_410 = local_120;
  local_408 = (RealSpace *)local_238;
  local_400 = local_120;
  local_3f8 = &local_1c0;
  local_3f0 = (RealSpace *)local_98;
  mnf::CartesianProduct::CartesianProduct((CartesianProduct *)local_378,&local_418,6);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)&local_418,(Manifold *)local_378,(Manifold *)local_238);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_2d8,(Manifold *)local_378,(Manifold *)&local_418);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S.name() = \n",0xc);
  puVar1 = (undefined8 *)mnf::Manifold::name_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*puVar1,puVar1[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  mnf::Manifold::display();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S2.name() = \n",0xd);
  puVar1 = (undefined8 *)mnf::Manifold::name_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*puVar1,puVar1[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  mnf::Manifold::display();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S3.name() = \n",0xd);
  puVar1 = (undefined8 *)mnf::Manifold::name_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*puVar1,puVar1[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  mnf::Manifold::display();
  local_2d8[0] = free;
  if (local_250 != (void *)0x0) {
    operator_delete(local_250);
  }
  if (local_268 != (void *)0x0) {
    operator_delete(local_268);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_280);
  mnf::Manifold::~Manifold((Manifold *)local_2d8);
  local_418 = (RealSpace *)free;
  if (local_390 != (void *)0x0) {
    operator_delete(local_390);
  }
  if (local_3a8 != (void *)0x0) {
    operator_delete(local_3a8);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_3c0);
  mnf::Manifold::~Manifold((Manifold *)&local_418);
  local_378[0] = free;
  if (local_2f0 != (void *)0x0) {
    operator_delete(local_2f0);
  }
  if (local_308 != (void *)0x0) {
    operator_delete(local_308);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_320);
  mnf::Manifold::~Manifold((Manifold *)local_378);
  local_1c0._0_8_ = &PTR__SO3_00144670;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap
            ((ReusableTemporaryMap *)((long)&local_1c0 + 0x58));
  mnf::Manifold::~Manifold(&local_1c0.super_Manifold);
  mnf::Manifold::~Manifold((Manifold *)local_120);
  local_238[0] = std::terminate;
  free(local_1d0);
  free(local_1e0);
  mnf::Manifold::~Manifold((Manifold *)local_238);
  local_98[0] = std::terminate;
  free(local_30);
  free(local_40);
  mnf::Manifold::~Manifold((Manifold *)local_98);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(displayTest)
{
  RealSpace R5(5);
  R5.display();
  RealSpace R2(2);
  S2 Sphere;
  Sphere.display();
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct S{&R5, &Sphere, &R2, &Sphere, &RotSpace, &R5};
  CartesianProduct S2(S, R2);
  CartesianProduct S3(S, S2);
  std::cout << "S.name() = \n" << S.name() << std::endl;
  S.display();
  std::cout << "S2.name() = \n" << S2.name() << std::endl;
  S2.display();
  std::cout << "S3.name() = \n" << S3.name() << std::endl;
  S3.display();
}